

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O3

int fits_execute_template(fitsfile *ff,char *ngp_template,int *status)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  ulong uVar7;
  int my_hn;
  int tmp0;
  int more_keys;
  int keys_exist;
  char grnm [80];
  int local_e8;
  int local_e4;
  int local_e0 [2];
  int local_d8 [20];
  char local_88 [79];
  undefined1 local_39;
  
  if (status == (int *)0x0) {
    iVar3 = 0x16a;
  }
  else {
    iVar3 = *status;
    if (iVar3 == 0) {
      iVar3 = 0x16a;
      if (ngp_template != (char *)0x0 && ff != (fitsfile *)0x0) {
        ngp_inclevel = 0;
        ngp_grplevel = 0;
        master_grp_idx = 1;
        ngp_master_dir[0] = '\0';
        iVar3 = ngp_delete_extver_tab();
        if (iVar3 == 0) {
          ffghdn(ff,&local_e8);
          if (local_e8 < 2) {
            ffmahd(ff,1,&local_e4,status);
            ffghsp(ff,local_d8,local_e0,status);
            ffmahd(ff,local_e8,&local_e4,status);
            if (*status != 0) {
              return *status;
            }
            bVar1 = 0 < local_d8[0];
          }
          else {
            iVar3 = 1;
            do {
              *status = 0;
              ffmahd(ff,1,&local_e4,status);
              if (*status != 0) break;
              ffgky(ff,0x10,"EXTNAME",local_d8,(char *)0x0,status);
              if (*status == 0) {
                ffgky(ff,0x29,"EXTVER",local_e0,(char *)0x0,status);
                iVar4 = local_e0[0];
                if (*status != 0) {
                  if (*status != 0xcc) goto LAB_001bef01;
                  *status = 0;
                  iVar4 = 1;
                }
                iVar4 = ngp_set_extver((char *)local_d8,iVar4);
                *status = iVar4;
              }
LAB_001bef01:
              iVar3 = iVar3 + 1;
            } while (iVar3 < local_e8);
            ffmahd(ff,local_e8,&local_e4,status);
            if (*status != 0) {
              return *status;
            }
            bVar1 = true;
          }
          iVar3 = ngp_include_file(ngp_template);
          *status = iVar3;
          if (iVar3 != 0) {
            return iVar3;
          }
          sVar6 = strlen(ngp_template);
          uVar7 = sVar6 & 0xffffffff;
          uVar5 = (int)sVar6 + 1;
          do {
            uVar7 = uVar7 - 1;
            if ((int)(uint)uVar7 < 0) goto LAB_001befa5;
            uVar5 = uVar5 - 1;
          } while (ngp_template[(uint)uVar7 & 0x7fffffff] != '/');
          if (0 < (int)uVar5) {
            uVar2 = 999;
            if (uVar5 < 999) {
              uVar2 = uVar5;
            }
            memcpy(ngp_master_dir,ngp_template,(ulong)uVar2);
            ngp_master_dir[uVar2] = '\0';
          }
LAB_001befa5:
          do {
            iVar3 = ngp_read_line(1);
            if (iVar3 != 0) break;
            iVar3 = 0x171;
            switch(ngp_keyidx) {
            case 1:
              if (ngp_linkey.type == 2) {
                strncpy(local_88,ngp_linkey.value.s,0x50);
              }
              else {
                master_grp_idx = master_grp_idx + 1;
                snprintf(local_88,0x50,"DEFAULT_GROUP_%d");
              }
              local_39 = 0;
              iVar3 = ngp_read_group(ff,local_88,0);
              goto LAB_001bf0f3;
            default:
              goto switchD_001befde_caseD_2;
            case 3:
              if (ngp_curline.line == (char *)0x0) {
LAB_001bf106:
                iVar3 = 0x16b;
                goto LAB_001bf138;
              }
              if (ngp_prevline.line != (char *)0x0) {
LAB_001bf10d:
                iVar3 = 0x16c;
                goto LAB_001bf11f;
              }
              iVar3 = (uint)(byte)~bVar1 * 2;
              break;
            case 4:
              if (bVar1) goto switchD_001befde_caseD_2;
              if (ngp_curline.line == (char *)0x0) goto LAB_001bf106;
              if (ngp_prevline.line != (char *)0x0) goto LAB_001bf10d;
              iVar3 = 3;
              break;
            case 5:
              iVar3 = 0;
              goto switchD_001befde_caseD_2;
            }
            ngp_prevline.format = ngp_curline.format;
            ngp_prevline.flags = ngp_curline.flags;
            ngp_prevline.comment = ngp_curline.comment;
            ngp_prevline._28_4_ = ngp_curline._28_4_;
            ngp_prevline.type = ngp_curline.type;
            ngp_prevline.value._4_4_ = ngp_curline.value._4_4_;
            ngp_prevline.value._0_4_ = ngp_curline.value._0_4_;
            ngp_prevline.name._4_4_ = ngp_curline.name._4_4_;
            ngp_prevline.name._0_4_ = ngp_curline.name._0_4_;
            ngp_prevline.line = ngp_curline.line;
            ngp_curline.line = (char *)0x0;
            iVar3 = ngp_read_xtension(ff,0,iVar3);
LAB_001bf0f3:
            bVar1 = true;
          } while (iVar3 == 0);
switchD_001befde_caseD_2:
          if (ngp_curline.line != (char *)0x0) {
LAB_001bf11f:
            free(ngp_curline.line);
            ngp_curline.value._0_4_ = 0;
            ngp_curline.value._4_4_ = 0;
            ngp_curline.type = 0;
            ngp_curline.line = (char *)0x0;
            ngp_curline.name._0_4_ = 0;
            ngp_curline.name._4_4_ = 0;
            ngp_curline.comment = (char *)0x0;
            ngp_curline.format = 0;
            ngp_curline.flags = 0;
          }
LAB_001bf138:
          if (ngp_prevline.line != (char *)0x0) {
            free(ngp_prevline.line);
            ngp_prevline.value._0_4_ = 0;
            ngp_prevline.value._4_4_ = 0;
            ngp_prevline.type = 0;
            ngp_prevline.line = (char *)0x0;
            ngp_prevline.name._0_4_ = 0;
            ngp_prevline.name._4_4_ = 0;
            ngp_prevline.comment = (char *)0x0;
            ngp_prevline.format = 0;
            ngp_prevline.flags = 0;
          }
          ngp_delete_extver_tab();
        }
      }
      *status = iVar3;
    }
  }
  return iVar3;
}

Assistant:

int	fits_execute_template(fitsfile *ff, char *ngp_template, int *status)
 { int		r, exit_flg, first_extension, i, my_hn, tmp0, keys_exist, more_keys, used_ver;
   char		grnm[NGP_MAX_STRING], used_name[NGP_MAX_STRING];
   long		luv;

   if (NULL == status) return(NGP_NUL_PTR);
   if (NGP_OK != *status) return(*status);

   /* This function uses many global variables (local to this file) and
      therefore is not thread-safe. */
   FFLOCK;
   
   if ((NULL == ff) || (NULL == ngp_template))
     { *status = NGP_NUL_PTR;
       FFUNLOCK;
       return(*status);
     }

   ngp_inclevel = 0;				/* initialize things, not all should be zero */
   ngp_grplevel = 0;
   master_grp_idx = 1;
   exit_flg = 0;
   ngp_master_dir[0] = 0;			/* this should be before 1st call to ngp_include_file */
   first_extension = 1;				/* we need to create PHDU */

   if (NGP_OK != (r = ngp_delete_extver_tab()))
     { *status = r;
       FFUNLOCK;
       return(r);
     }

   fits_get_hdu_num(ff, &my_hn);		/* our HDU position */
   if (my_hn <= 1)				/* check whether we really need to create PHDU */
     { fits_movabs_hdu(ff, 1, &tmp0, status);
       fits_get_hdrspace(ff, &keys_exist, &more_keys, status);
       fits_movabs_hdu(ff, my_hn, &tmp0, status);
       if (NGP_OK != *status) /* error here means file is corrupted */
       {
          FFUNLOCK;
          return(*status);	
       }
       if (keys_exist > 0) first_extension = 0;	/* if keywords exist assume PHDU already exist */
     }
   else
     { first_extension = 0;			/* PHDU (followed by 1+ extensions) exist */

       for (i = 2; i<= my_hn; i++)
        { *status = NGP_OK;
          fits_movabs_hdu(ff, 1, &tmp0, status);
          if (NGP_OK != *status) break;

          fits_read_key(ff, TSTRING, "EXTNAME", used_name, NULL, status);
          if (NGP_OK != *status)  continue;

          fits_read_key(ff, TLONG, "EXTVER", &luv, NULL, status);
          used_ver = luv;			/* bugfix - 22-Jan-99, BO - nonalignment of OSF/Alpha */
          if (VALUE_UNDEFINED == *status)
            { used_ver = 1;
              *status = NGP_OK;
            }

          if (NGP_OK == *status) *status = ngp_set_extver(used_name, used_ver);
        }

       fits_movabs_hdu(ff, my_hn, &tmp0, status);
     }
     
   if (NGP_OK != *status) {
      FFUNLOCK;
      return(*status);
   }                                                                       
   if (NGP_OK != (*status = ngp_include_file(ngp_template))) {
      FFUNLOCK;
      return(*status);
   }
   
   for (i = strlen(ngp_template) - 1; i >= 0; i--) /* strlen is > 0, otherwise fopen failed */
    { 
#ifdef MSDOS
      if ('\\' == ngp_template[i]) break;
#else
      if ('/' == ngp_template[i]) break;
#endif
    } 
      
   i++;
   if (i > (NGP_MAX_FNAME - 1)) i = NGP_MAX_FNAME - 1;

   if (i > 0)
     { memcpy(ngp_master_dir, ngp_template, i);
       ngp_master_dir[i] = 0;
     }


   for (;;)
    { if (NGP_OK != (r = ngp_read_line(1))) break;	/* EOF always means error here */
      switch (ngp_keyidx)
       {
         case NGP_TOKEN_SIMPLE:
			if (0 == first_extension)	/* simple only allowed in first HDU */
			  { r = NGP_TOKEN_NOT_EXPECT;
			    break;
			  }
			if (NGP_OK != (r = ngp_unread_line())) break;
			r = ngp_read_xtension(ff, 0, NGP_XTENSION_SIMPLE | NGP_XTENSION_FIRST);
			first_extension = 0;
			break;

         case NGP_TOKEN_XTENSION:
			if (NGP_OK != (r = ngp_unread_line())) break;
			r = ngp_read_xtension(ff, 0, (first_extension ? NGP_XTENSION_FIRST : 0));
			first_extension = 0;
			break;

         case NGP_TOKEN_GROUP:
			if (NGP_TTYPE_STRING == ngp_linkey.type)
			  { strncpy(grnm, ngp_linkey.value.s, NGP_MAX_STRING); }
			else
			  { snprintf(grnm,NGP_MAX_STRING, "DEFAULT_GROUP_%d", master_grp_idx++); }
			grnm[NGP_MAX_STRING - 1] = 0;
			r = ngp_read_group(ff, grnm, 0);
			first_extension = 0;
			break;

	 case NGP_TOKEN_EOF:
			exit_flg = 1;
			break;

         default:	r = NGP_TOKEN_NOT_EXPECT;
			break;
       }
      if (exit_flg || (NGP_OK != r)) break;
    }

/* all top level HDUs up to faulty one are left intact in case of i/o error. It is up
   to the caller to call fits_close_file or fits_delete_file when this function returns
   error. */

   ngp_free_line();		/* deallocate last line (if any) */
   ngp_free_prevline();		/* deallocate cached line (if any) */
   ngp_delete_extver_tab();	/* delete extver table (if present), error ignored */
   
   *status = r;
   FFUNLOCK;
   return(r);
 }